

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_3::containsSubType
               (VarType *complexType,DataType basicType)

{
  Type TVar1;
  pointer pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  VarType *complexType_00;
  ulong uVar6;
  ulong uVar7;
  
  for (; TVar1 = complexType->m_type, TVar1 == TYPE_ARRAY;
      complexType = (complexType->m_data).array.elementType) {
  }
  if (TVar1 == TYPE_BASIC) {
    bVar3 = (complexType->m_data).basic.type == TYPE_UINT_ATOMIC_COUNTER;
  }
  else if (TVar1 == TYPE_STRUCT) {
    pSVar2 = (((complexType->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = ((long)(((complexType->m_data).structPtr)->m_members).
                   super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)pSVar2) / 0x38;
    iVar4 = (int)uVar5;
    uVar7 = 0;
    uVar6 = 0;
    if (0 < iVar4) {
      uVar6 = uVar5 & 0xffffffff;
    }
    complexType_00 = &pSVar2->m_type;
    do {
      if (uVar6 == uVar7) {
        return (long)uVar7 < (long)iVar4;
      }
      bVar3 = containsSubType(complexType_00,basicType);
      uVar7 = uVar7 + 1;
      complexType_00 = (VarType *)&complexType_00[2].m_data;
    } while (!bVar3);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool containsSubType (const glu::VarType& complexType, glu::DataType basicType)
{
	if (complexType.isBasicType())
	{
		return complexType.getBasicType() == basicType;
	}
	else if (complexType.isArrayType())
	{
		return containsSubType(complexType.getElementType(), basicType);
	}
	else if (complexType.isStructType())
	{
		for (int ndx = 0; ndx < complexType.getStructPtr()->getNumMembers(); ++ndx)
			if (containsSubType(complexType.getStructPtr()->getMember(ndx).getType(), basicType))
				return true;
		return false;
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}